

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_set.c
# Opt level: O0

int mpt_color_typeid(void)

{
  int local_c;
  int type;
  
  local_c = mpt_color_typeid::ptype;
  if ((mpt_color_typeid::ptype == 0) && (local_c = mpt_type_basic_add(4), 0 < local_c)) {
    mpt_color_typeid::ptype = local_c;
  }
  return local_c;
}

Assistant:

extern int mpt_color_typeid(void)
{
	static int ptype = 0;
	int type;
	if (!(type = ptype)) {
		if ((type = mpt_type_basic_add(sizeof(MPT_STRUCT(color)))) > 0) {
			ptype = type;
		}
	}
	return type;
}